

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_read_write_wire.c
# Opt level: O0

int main(void)

{
  FILE *__stream;
  PaDeviceInfo *pPVar1;
  PaDeviceInfo *pPVar2;
  void *__s;
  char *pcVar3;
  uint local_88;
  int numChannels;
  int numBytes;
  int i;
  char *sampleBlock;
  PaDeviceInfo *outputInfo;
  PaDeviceInfo *inputInfo;
  PaStream *pPStack_58;
  PaError err;
  PaStream *stream;
  PaStreamParameters outputParameters;
  PaStreamParameters inputParameters;
  
  pPStack_58 = (PaStream *)0x0;
  printf("patest_read_write_wire.c\n");
  fflush(_stdout);
  printf("sizeof(int) = %lu\n",4);
  fflush(_stdout);
  printf("sizeof(long) = %lu\n",8);
  fflush(_stdout);
  inputInfo._4_4_ = Pa_Initialize();
  if (inputInfo._4_4_ == 0) {
    outputParameters.hostApiSpecificStreamInfo._0_4_ = Pa_GetDefaultInputDevice();
    printf("Input device # %d.\n",(ulong)(uint)outputParameters.hostApiSpecificStreamInfo);
    pPVar1 = Pa_GetDeviceInfo((uint)outputParameters.hostApiSpecificStreamInfo);
    printf("    Name: %s\n",pPVar1->name);
    printf("      LL: %g s\n",pPVar1->defaultLowInputLatency);
    printf("      HL: %g s\n",pPVar1->defaultHighInputLatency);
    stream._0_4_ = Pa_GetDefaultOutputDevice();
    printf("Output device # %d.\n",(ulong)(uint)stream);
    pPVar2 = Pa_GetDeviceInfo((uint)stream);
    printf("   Name: %s\n",pPVar2->name);
    printf("     LL: %g s\n",pPVar2->defaultLowOutputLatency);
    printf("     HL: %g s\n",pPVar2->defaultHighOutputLatency);
    if (pPVar1->maxInputChannels < pPVar2->maxOutputChannels) {
      local_88 = pPVar1->maxInputChannels;
    }
    else {
      local_88 = pPVar2->maxOutputChannels;
    }
    printf("Num channels = %d.\n",(ulong)local_88);
    outputParameters.hostApiSpecificStreamInfo._4_4_ = local_88;
    stream._4_4_ = local_88;
    outputParameters.device = 1;
    outputParameters.channelCount = 0;
    outputParameters.sampleFormat = (PaSampleFormat)pPVar2->defaultHighOutputLatency;
    outputParameters.suggestedLatency = 0.0;
    inputInfo._4_4_ =
         Pa_OpenStream(&stack0xffffffffffffffa8,
                       (PaStreamParameters *)&outputParameters.hostApiSpecificStreamInfo,
                       (PaStreamParameters *)&stream,44100.0,0x200,1,(PaStreamCallback *)0x0,
                       (void *)0x0);
    if (inputInfo._4_4_ == 0) {
      __s = malloc((long)(int)(local_88 << 0xb));
      if (__s == (void *)0x0) {
        printf("Could not allocate record array.\n");
      }
      else {
        memset(__s,0,(long)(int)(local_88 << 0xb));
        inputInfo._4_4_ = Pa_StartStream(pPStack_58);
        if (inputInfo._4_4_ == 0) {
          printf("Wire on. Will run %d seconds.\n",10);
          fflush(_stdout);
          for (numChannels = 0; numChannels < 0x35d; numChannels = numChannels + 1) {
            inputInfo._4_4_ = Pa_WriteStream(pPStack_58,__s,0x200);
            if ((inputInfo._4_4_ != 0) ||
               (inputInfo._4_4_ = Pa_ReadStream(pPStack_58,__s,0x200), inputInfo._4_4_ != 0)) {
              printf("err = %d\n",(ulong)inputInfo._4_4_);
              fflush(_stdout);
              if (pPStack_58 != (PaStream *)0x0) {
                Pa_AbortStream(pPStack_58);
                Pa_CloseStream(pPStack_58);
              }
              free(__s);
              Pa_Terminate();
              if ((inputInfo._4_4_ & 2) != 0) {
                fprintf(_stderr,"Input Overflow.\n");
              }
              if ((inputInfo._4_4_ & 4) != 0) {
                fprintf(_stderr,"Output Underflow.\n");
              }
              return -2;
            }
          }
          printf("Wire off.\n");
          fflush(_stdout);
          inputInfo._4_4_ = Pa_StopStream(pPStack_58);
          if (inputInfo._4_4_ == 0) {
            free(__s);
            Pa_Terminate();
            return 0;
          }
        }
      }
      free(__s);
    }
  }
  if (pPStack_58 != (PaStream *)0x0) {
    Pa_AbortStream(pPStack_58);
    Pa_CloseStream(pPStack_58);
  }
  Pa_Terminate();
  fprintf(_stderr,"An error occured while using the portaudio stream\n");
  fprintf(_stderr,"Error number: %d\n",(ulong)inputInfo._4_4_);
  __stream = _stderr;
  pcVar3 = Pa_GetErrorText(inputInfo._4_4_);
  fprintf(__stream,"Error message: %s\n",pcVar3);
  return -1;
}

Assistant:

int main(void)
{
    PaStreamParameters inputParameters, outputParameters;
    PaStream *stream = NULL;
    PaError err;
    const PaDeviceInfo* inputInfo;
    const PaDeviceInfo* outputInfo;
    char *sampleBlock = NULL;
    int i;
    int numBytes;

    printf("patest_read_write_wire.c\n"); fflush(stdout);
    printf("sizeof(int) = %lu\n", sizeof(int)); fflush(stdout);
    printf("sizeof(long) = %lu\n", sizeof(long)); fflush(stdout);

    err = Pa_Initialize();
    if( err != paNoError ) goto error2;

    inputParameters.device = Pa_GetDefaultInputDevice(); /* default input device */
    printf( "Input device # %d.\n", inputParameters.device );
    inputInfo = Pa_GetDeviceInfo( inputParameters.device );
    printf( "    Name: %s\n", inputInfo->name );
    printf( "      LL: %g s\n", inputInfo->defaultLowInputLatency );
    printf( "      HL: %g s\n", inputInfo->defaultHighInputLatency );

    outputParameters.device = Pa_GetDefaultOutputDevice(); /* default output device */
    printf( "Output device # %d.\n", outputParameters.device );
    outputInfo = Pa_GetDeviceInfo( outputParameters.device );
    printf( "   Name: %s\n", outputInfo->name );
    printf( "     LL: %g s\n", outputInfo->defaultLowOutputLatency );
    printf( "     HL: %g s\n", outputInfo->defaultHighOutputLatency );

    int numChannels = inputInfo->maxInputChannels < outputInfo->maxOutputChannels
            ? inputInfo->maxInputChannels : outputInfo->maxOutputChannels;
    printf( "Num channels = %d.\n", numChannels );

    inputParameters.channelCount = numChannels;
    inputParameters.sampleFormat = PA_SAMPLE_TYPE;
    inputParameters.suggestedLatency = inputInfo->defaultHighInputLatency ;
    inputParameters.hostApiSpecificStreamInfo = NULL;

    outputParameters.channelCount = numChannels;
    outputParameters.sampleFormat = PA_SAMPLE_TYPE;
    outputParameters.suggestedLatency = outputInfo->defaultHighOutputLatency;
    outputParameters.hostApiSpecificStreamInfo = NULL;

    /* -- setup -- */

    err = Pa_OpenStream(
              &stream,
              &inputParameters,
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              NULL, /* no callback, use blocking API */
              NULL ); /* no callback, so no callback userData */
    if( err != paNoError ) goto error2;

    numBytes = FRAMES_PER_BUFFER * numChannels * SAMPLE_SIZE ;
    sampleBlock = (char *) malloc( numBytes );
    if( sampleBlock == NULL )
    {
        printf("Could not allocate record array.\n");
        goto error1;
    }
    memset( sampleBlock, SAMPLE_SILENCE, numBytes );

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto error1;
    printf("Wire on. Will run %d seconds.\n", NUM_SECONDS); fflush(stdout);

    for( i=0; i<(NUM_SECONDS*SAMPLE_RATE)/FRAMES_PER_BUFFER; ++i )
    {
        // You may get underruns or overruns if the output is not primed by PortAudio.
        err = Pa_WriteStream( stream, sampleBlock, FRAMES_PER_BUFFER );
        if( err ) goto xrun;
        err = Pa_ReadStream( stream, sampleBlock, FRAMES_PER_BUFFER );
        if( err ) goto xrun;
    }
    printf("Wire off.\n"); fflush(stdout);

    err = Pa_StopStream( stream );
    if( err != paNoError ) goto error1;

    free( sampleBlock );

    Pa_Terminate();
    return 0;

xrun:
    printf("err = %d\n", err); fflush(stdout);
    if( stream ) {
       Pa_AbortStream( stream );
       Pa_CloseStream( stream );
    }
    free( sampleBlock );
    Pa_Terminate();
    if( err & paInputOverflow )
       fprintf( stderr, "Input Overflow.\n" );
    if( err & paOutputUnderflow )
       fprintf( stderr, "Output Underflow.\n" );
    return -2;
error1:
    free( sampleBlock );
error2:
    if( stream ) {
       Pa_AbortStream( stream );
       Pa_CloseStream( stream );
    }
    Pa_Terminate();
    fprintf( stderr, "An error occured while using the portaudio stream\n" );
    fprintf( stderr, "Error number: %d\n", err );
    fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
    return -1;
}